

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O0

ValueHolder * __thiscall
testing::internal::
ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
::DefaultValueHolderFactory::MakeNewHolder(DefaultValueHolderFactory *this)

{
  ValueHolder *this_00;
  DefaultValueHolderFactory *this_local;
  
  this_00 = (ValueHolder *)operator_new(0x20);
  ValueHolder::ValueHolder(this_00);
  return this_00;
}

Assistant:

virtual ValueHolder* MakeNewHolder() const { return new ValueHolder(); }